

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_segwit_tests.cpp
# Opt level: O0

void __thiscall
script_segwit_tests::IsPayToWitnessScriptHash_Valid::test_method
          (IsPayToWitnessScriptHash_Valid *this)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  last;
  span<const_unsigned_char,_18446744073709551615UL> b;
  initializer_list<unsigned_char> __l;
  bool bVar1;
  long in_FS_OFFSET;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  CScript p2wsh;
  uint256 dummy;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  assertion_result *in_stack_fffffffffffffd88;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_fffffffffffffd98;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  unit_test_log_t *in_stack_fffffffffffffda8;
  const_string *in_stack_fffffffffffffdb0;
  const_string *file;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdb8;
  unit_test_log_t *this_00;
  iterator in_stack_fffffffffffffdc0;
  const_iterator __position;
  const_string local_1c0 [2];
  lazy_ostream local_1a0 [2];
  uchar local_129;
  unit_test_log_t local_128 [3];
  const_string local_110 [2];
  assertion_result local_d0 [4];
  undefined1 local_6a;
  undefined1 local_69;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uint256::uint256((uint256 *)in_stack_fffffffffffffd78);
  CScript::CScript((CScript *)in_stack_fffffffffffffd78);
  CScript::operator<<((CScript *)in_stack_fffffffffffffdb0,
                      (opcodetype)((ulong)in_stack_fffffffffffffda8 >> 0x20));
  ToByteVector<uint256>((uint256 *)in_stack_fffffffffffffdb8._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffffd88,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  b._M_extent._M_extent_value = in_stack_fffffffffffffdb8._M_extent_value;
  b._M_ptr = (pointer)in_stack_fffffffffffffdb0;
  CScript::operator<<((CScript *)in_stack_fffffffffffffd98._M_current,b);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd88);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffffdb8._M_extent_value,
               in_stack_fffffffffffffdb0,(size_t)in_stack_fffffffffffffda8,
               (const_string *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    CScript::IsPayToWitnessScriptHash((CScript *)in_stack_fffffffffffffd88);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffd88,(bool)in_stack_fffffffffffffd87);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd78 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d0,(lazy_ostream *)&stack0xffffffffffffff10,local_110,0x11,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  local_6a = 0;
  local_69 = 0x20;
  __position._M_current = &local_129;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd78);
  __l._M_len = (size_type)__position._M_current;
  __l._M_array = in_stack_fffffffffffffdc0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             in_stack_fffffffffffffdb8._M_extent_value,__l,
             (allocator_type *)in_stack_fffffffffffffdb0);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffffd78);
  this_00 = local_128;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  __gnu_cxx::
  __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>::
  __normal_iterator<unsigned_char*>
            ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffd88,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::insert
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),__position,
             (size_type)in_stack_fffffffffffffd98._M_current,
             (value_type_conflict3 *)CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90));
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffffda8,
               (const_string *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    in_stack_fffffffffffffda8 = local_128;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
    last._M_current._7_1_ = in_stack_fffffffffffffd97;
    last._M_current._0_7_ = in_stack_fffffffffffffd90;
    CScript::
    CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ((CScript *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd98,last);
    in_stack_fffffffffffffda7 =
         CScript::IsPayToWitnessScriptHash((CScript *)in_stack_fffffffffffffd88);
    boost::test_tools::assertion_result::assertion_result
              (in_stack_fffffffffffffd88,(bool)in_stack_fffffffffffffd87);
    in_stack_fffffffffffffd98._M_current = (uchar *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (basic_cstring<const_char> *)in_stack_fffffffffffffd78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffd88,
               (pointer)CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
               (unsigned_long)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd78 =
         (lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
          *)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&stack0xfffffffffffffe80,local_1a0,local_1c0,0x15,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(in_stack_fffffffffffffd78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffd78);
    CScript::~CScript((CScript *)in_stack_fffffffffffffd78);
    in_stack_fffffffffffffd97 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffd97);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffd88);
  CScript::~CScript((CScript *)in_stack_fffffffffffffd78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(IsPayToWitnessScriptHash_Valid)
{
    uint256 dummy;
    CScript p2wsh;
    p2wsh << OP_0 << ToByteVector(dummy);
    BOOST_CHECK(p2wsh.IsPayToWitnessScriptHash());

    std::vector<unsigned char> bytes = {OP_0, 32};
    bytes.insert(bytes.end(), 32, 0);
    BOOST_CHECK(CScript(bytes.begin(), bytes.end()).IsPayToWitnessScriptHash());
}